

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void * ndiThreadFunc(void *userdata)

{
  char *__s;
  char *reply;
  int iVar1;
  uint uVar2;
  ulong in_RAX;
  size_t sVar3;
  int iVar4;
  int errorCode;
  int errorCode_1;
  undefined8 local_38;
  
  local_38 = in_RAX & 0xffffffff00000000;
  __s = *(char **)((long)userdata + 0x60);
  reply = *(char **)((long)userdata + 0x68);
  do {
    ndiMutexLock(*(pthread_mutex_t **)((long)userdata + 0x48));
    if (*(char *)((long)userdata + 0x39) == '\0') {
      ndiMutexUnlock(*(pthread_mutex_t **)((long)userdata + 0x48));
      return (void *)0x0;
    }
    iVar4 = *userdata;
    if (*__s == '\0') {
      if (iVar4 == -1) {
        ndiSocketSleep(*(NDISocketHandle *)((long)userdata + 0x10),0x14);
      }
      else {
        ndiSerialSleep(iVar4,0x14);
      }
    }
    else {
      if (iVar4 == -1) {
        ndiSocketFlush(*(NDISocketHandle *)((long)userdata + 0x10),1);
      }
      else {
        ndiSerialFlush(iVar4,1);
      }
      sVar3 = strlen(__s);
      if ((int)local_38 == 0) {
        iVar4 = (int)sVar3;
        if (*userdata == -1) {
          iVar1 = ndiSocketWrite(*(NDISocketHandle *)((long)userdata + 0x10),__s,iVar4);
        }
        else {
          iVar1 = ndiSerialWrite(*userdata,__s,iVar4);
        }
        if (iVar1 < 0) {
          local_38 = CONCAT44(local_38._4_4_,0x104);
        }
        else if (iVar1 < iVar4) {
          local_38 = CONCAT44(local_38._4_4_,0x103);
        }
        else if ((int)local_38 == 0) {
          if (*userdata == -1) {
            uVar2 = ndiSocketRead(*(NDISocketHandle *)((long)userdata + 0x10),reply,0x7ff,
                                  *(bool *)((long)userdata + 0x78),(int *)((long)&local_38 + 4));
          }
          else {
            uVar2 = ndiSerialRead(*userdata,reply,0x7ff,*(bool *)((long)userdata + 0x78),
                                  (int *)&local_38);
          }
          if ((int)uVar2 < 0) {
            local_38 = CONCAT44(local_38._4_4_,0x105);
LAB_0010aade:
            uVar2 = 0;
          }
          else if (uVar2 == 0) {
            local_38 = CONCAT44(local_38._4_4_,0x103);
            goto LAB_0010aade;
          }
          reply[uVar2] = '\0';
        }
      }
      ndiMutexLock(*(pthread_mutex_t **)((long)userdata + 0x50));
      strcpy(*(char **)((long)userdata + 0x70),reply);
      *(int *)((long)userdata + 0x7c) = (int)local_38;
      ndiEventSignal(*(pl_cond_and_mutex_t **)((long)userdata + 0x58));
      ndiMutexUnlock(*(pthread_mutex_t **)((long)userdata + 0x50));
    }
    ndiMutexUnlock(*(pthread_mutex_t **)((long)userdata + 0x48));
    if ((int)local_38 != 0) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

static void* ndiThreadFunc(void* userdata)
{
  int i, m;
  int errorCode = 0;
  char* command, *reply;
  ndicapi* pol;

  pol = (ndicapi*)userdata;
  command = pol->ThreadCommand;
  reply = pol->ThreadReply;

  while (errorCode == 0)
  {
    // if the application is blocking us, we sit here and wait
    ndiMutexLock(pol->ThreadMutex);

    // quit if threading has been turned off
    if (!pol->IsThreadedMode)
    {
      ndiMutexUnlock(pol->ThreadMutex);
      return NULL;
    }

    // check whether we have a GX/BX/TX command ready to send
    if (command[0] == '\0')
    {
      if (pol->SerialDevice != NDI_INVALID_HANDLE)
      {
        ndiSerialSleep(pol->SerialDevice, 20);
      }
      else
      {
        ndiSocketSleep(pol->Socket, 20);
      }
      ndiMutexUnlock(pol->ThreadMutex);
      continue;
    }

    // flush the input buffer, because anything that we haven't read
    //   yet is garbage left over by a previously failed command
    if (pol->SerialDevice != NDI_INVALID_HANDLE)
    {
      ndiSerialFlush(pol->SerialDevice, NDI_IFLUSH);
    }
    else
    {
      ndiSocketFlush(pol->Socket, NDI_IFLUSH);
    }

    // send the command to the Measurement System
    i = strlen(command);
    if (errorCode == 0)
    {
      if (pol->SerialDevice != NDI_INVALID_HANDLE)
      {
        m = ndiSerialWrite(pol->SerialDevice, command, i);
      }
      else
      {
        m = ndiSocketWrite(pol->Socket, command, i);
      }
      if (m < 0)
      {
        errorCode = NDI_WRITE_ERROR;
      }
      else if (m < i)
      {
        errorCode = NDI_TIMEOUT;
      }
    }

    // read the reply from the Measurement System
    if (errorCode == 0)
    {
      if (pol->SerialDevice != NDI_INVALID_HANDLE)
      {
        m = ndiSerialRead(pol->SerialDevice, reply, 2047, pol->IsThreadedCommandBinary, &errorCode);
      }
      else
      {
        int errorCode;
        m = ndiSocketRead(pol->Socket, reply, 2047, pol->IsThreadedCommandBinary, &errorCode);
      }
      if (m < 0)
      {
        errorCode = NDI_READ_ERROR;
        m = 0;
      }
      else if (m == 0)
      {
        errorCode = NDI_TIMEOUT;
      }
      // terminate the string
      reply[m] = '\0';
    }

    // lock the buffer
    ndiMutexLock(pol->ThreadBufferMutex);
    // copy the reply into the buffer, also copy the error code
    strcpy(pol->ThreadBuffer, reply);
    pol->ThreadErrorCode = errorCode;
    // signal the main thread that a new data record is ready
    ndiEventSignal(pol->ThreadBufferEvent);
    // unlock the buffer
    ndiMutexUnlock(pol->ThreadBufferMutex);

    // release the lock to give the application a chance to block us
    ndiMutexUnlock(pol->ThreadMutex);
  }

  return NULL;
}